

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O1

ON_ClippingPlaneInfo * __thiscall
ON_ClippingPlane::ClippingPlaneInfo
          (ON_ClippingPlaneInfo *__return_storage_ptr__,ON_ClippingPlane *this)

{
  double dVar1;
  double dVar2;
  undefined8 uVar3;
  unsigned_short uVar4;
  unsigned_short uVar5;
  ON_ClippingPlaneData *pOVar6;
  double dVar7;
  
  ON_PlaneEquation::ON_PlaneEquation(&__return_storage_ptr__->m_plane_equation);
  (__return_storage_ptr__->m_plane_id).Data1 = 0;
  (__return_storage_ptr__->m_plane_id).Data2 = 0;
  (__return_storage_ptr__->m_plane_id).Data3 = 0;
  (__return_storage_ptr__->m_plane_id).Data4[0] = '\0';
  (__return_storage_ptr__->m_plane_id).Data4[1] = '\0';
  (__return_storage_ptr__->m_plane_id).Data4[2] = '\0';
  (__return_storage_ptr__->m_plane_id).Data4[3] = '\0';
  (__return_storage_ptr__->m_plane_id).Data4[4] = '\0';
  (__return_storage_ptr__->m_plane_id).Data4[5] = '\0';
  (__return_storage_ptr__->m_plane_id).Data4[6] = '\0';
  (__return_storage_ptr__->m_plane_id).Data4[7] = '\0';
  __return_storage_ptr__->m_bEnabled = false;
  __return_storage_ptr__->m_depth_enabled = false;
  __return_storage_ptr__->m_reserved[0] = '\0';
  __return_storage_ptr__->m_reserved[1] = '\0';
  __return_storage_ptr__->m_depth = 0.0;
  dVar7 = (this->m_plane).plane_equation.x;
  dVar1 = (this->m_plane).plane_equation.y;
  dVar2 = (this->m_plane).plane_equation.d;
  (__return_storage_ptr__->m_plane_equation).z = (this->m_plane).plane_equation.z;
  (__return_storage_ptr__->m_plane_equation).d = dVar2;
  (__return_storage_ptr__->m_plane_equation).x = dVar7;
  (__return_storage_ptr__->m_plane_equation).y = dVar1;
  uVar4 = (this->m_plane_id).Data2;
  uVar5 = (this->m_plane_id).Data3;
  uVar3 = *(undefined8 *)(this->m_plane_id).Data4;
  (__return_storage_ptr__->m_plane_id).Data1 = (this->m_plane_id).Data1;
  (__return_storage_ptr__->m_plane_id).Data2 = uVar4;
  (__return_storage_ptr__->m_plane_id).Data3 = uVar5;
  *(undefined8 *)(__return_storage_ptr__->m_plane_id).Data4 = uVar3;
  __return_storage_ptr__->m_bEnabled = this->m_bEnabled;
  pOVar6 = GetClippingPlaneData((this->m_data_store).m_sn);
  dVar7 = 0.0;
  if (pOVar6 != (ON_ClippingPlaneData *)0x0) {
    dVar7 = pOVar6->m_depth;
  }
  if (0.0 <= dVar7) {
    __return_storage_ptr__->m_depth = (float)dVar7;
  }
  __return_storage_ptr__->m_depth_enabled = this->m_depth_enabled;
  return __return_storage_ptr__;
}

Assistant:

ON_ClippingPlaneInfo ON_ClippingPlane::ClippingPlaneInfo() const
{
  ON_ClippingPlaneInfo info;
  info.m_plane_equation = m_plane.plane_equation;
  info.m_plane_id = m_plane_id;
  info.m_bEnabled = m_bEnabled;
  info.SetDepth(Depth());
  info.SetDepthEnabled(m_depth_enabled);
  return info;
}